

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::
DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody
          (DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test *this)

{
  pointer ptVar1;
  pointer ptVar2;
  ulong uVar3;
  allocator_type *paVar4;
  allocator_type *paVar5;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  Reflection *extraout_RDX_01;
  Reflection *extraout_RDX_02;
  Reflection *pRVar6;
  thread *thread;
  ulong uVar7;
  ulong __n;
  allocator_type *paVar8;
  int iVar9;
  Metadata MVar10;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  TestAllTypes message;
  vector<std::thread,_std::allocator<std::thread>_> local_3b8;
  Descriptor *local_3a0;
  id local_398;
  thread local_390 [2];
  Descriptor *local_380;
  int local_378;
  TestAllTypes local_370;
  
  local_398._M_thread = (native_handle_type)this;
  proto2_unittest::TestAllTypes::TestAllTypes(&local_370,(Arena *)0x0);
  MVar10 = proto2_unittest::TestAllTypes::GetMetadata
                     ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (MVar10.descriptor)->field_count_) {
    iVar9 = 0;
    local_3a0 = MVar10.descriptor;
    do {
      ptVar2 = local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar1 = local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_380 = MVar10.descriptor;
      local_390[0]._M_id._M_thread = (id)(id)local_398._M_thread;
      local_378 = iVar9;
      if (local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar7 = (long)local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar3 = uVar7 + (uVar7 == 0);
        __n = uVar3 + uVar7;
        if (0xffffffffffffffe < __n) {
          __n = 0xfffffffffffffff;
        }
        if (CARRY8(uVar3,uVar7)) {
          __n = 0xfffffffffffffff;
        }
        if (__n == 0) {
          paVar4 = (allocator_type *)0x0;
        }
        else {
          paVar4 = (allocator_type *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)&local_3b8,__n,(void *)0x0);
          MVar10.reflection = extraout_RDX_00;
          MVar10.descriptor = local_380;
        }
        local_380 = MVar10.descriptor;
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__1>
                  (paVar4 + uVar7 * 8,local_390,
                   (anon_class_32_4_a47d18ca_for__M_head_impl *)MVar10.reflection);
        paVar8 = paVar4;
        for (paVar5 = (allocator_type *)ptVar1; paVar5 != (allocator_type *)ptVar2;
            paVar5 = paVar5 + 8) {
          *(native_handle_type *)paVar8 = (native_handle_type)*(id *)paVar5;
          *(id *)paVar5 = (id)0x0;
          paVar8 = paVar8 + 8;
        }
        pRVar6 = extraout_RDX_01;
        if ((allocator_type *)ptVar1 != (allocator_type *)0x0) {
          operator_delete(ptVar1,(long)local_3b8.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ptVar1);
          pRVar6 = extraout_RDX_02;
        }
        local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(paVar4 + __n * 8);
        local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar4;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__1>
                  ((allocator_type *)
                   local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_390,
                   (anon_class_32_4_a47d18ca_for__M_head_impl *)MVar10.reflection);
        pRVar6 = extraout_RDX;
        paVar8 = (allocator_type *)
                 local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      paVar8 = paVar8 + 8;
      iVar9 = iVar9 + 1;
      MVar10.reflection = pRVar6;
      MVar10.descriptor = local_3a0;
      paVar4 = (allocator_type *)
               local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_3b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)paVar8;
    } while (iVar9 < local_3a0->field_count_);
    for (; paVar4 != paVar8; paVar4 = paVar4 + 8) {
      std::thread::join();
    }
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_3b8);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_370);
  return;
}

Assistant:

TEST_F(DescriptorPoolMemoizationTest, MemoizeProjectionMultithreaded) {
  auto name_lambda = [](const FieldDescriptor* field) {
    return field->full_name();
  };
  proto2_unittest::TestAllTypes message;
  const Descriptor* descriptor = message.GetDescriptor();
  std::vector<std::thread> threads;
  for (int i = 0; i < descriptor->field_count(); ++i) {
    threads.emplace_back([this, name_lambda, descriptor, i]() {
      auto name = DescriptorPoolMemoizationTest::MemoizeProjection(
          descriptor->field(i), name_lambda);
      auto first_name = DescriptorPoolMemoizationTest::MemoizeProjection(
          descriptor->field(0), name_lambda);
      ASSERT_THAT(name, HasSubstr("proto2_unittest.TestAllTypes"));
      if (i != 0) {
        ASSERT_NE(name, "proto2_unittest.TestAllTypes.optional_int32");
      }
      ASSERT_EQ(first_name, "proto2_unittest.TestAllTypes.optional_int32");
    });
  }
  for (auto& thread : threads) {
    thread.join();
  }
}